

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCover.c
# Opt level: O1

Mvc_Cover_t * Mvc_CoverClone(Mvc_Cover_t *p)

{
  Mvc_Cover_t *pMVar1;
  
  pMVar1 = (Mvc_Cover_t *)Extra_MmFixedEntryFetch(p->pMem->pManC);
  pMVar1->pMem = p->pMem;
  pMVar1->nBits = p->nBits;
  pMVar1->nWords = p->nWords;
  pMVar1->nUnused = p->nUnused;
  pMVar1->nCubesAlloc = 0;
  pMVar1->pCubes = (Mvc_Cube_t **)0x0;
  (pMVar1->lCubes).nItems = 0;
  (pMVar1->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pMVar1->lCubes).pTail = (Mvc_Cube_t *)0x0;
  pMVar1->pLits = (int *)0x0;
  pMVar1->pMask = (Mvc_Cube_t *)0x0;
  return pMVar1;
}

Assistant:

Mvc_Cover_t * Mvc_CoverClone( Mvc_Cover_t * p )
{
    Mvc_Cover_t * pCover;
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    pCover                = (Mvc_Cover_t *)ABC_ALLOC( char, sizeof(Mvc_Cover_t) );
#else
    pCover                = (Mvc_Cover_t *)Extra_MmFixedEntryFetch( p->pMem->pManC );
#endif
    pCover->pMem          = p->pMem;
    pCover->nBits         = p->nBits;
    pCover->nWords        = p->nWords;
    pCover->nUnused       = p->nUnused;
    pCover->lCubes.nItems = 0;
    pCover->lCubes.pHead  = NULL;
    pCover->lCubes.pTail  = NULL;
    pCover->nCubesAlloc   = 0;
    pCover->pCubes        = NULL;
    pCover->pMask         = NULL;
    pCover->pLits         = NULL;
    return pCover;
}